

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O3

Promise<kj::AuthenticatedStream> __thiscall
kj::anon_unknown_0::FdConnectionReceiver::acceptImpl(FdConnectionReceiver *this,bool authenticated)

{
  PromiseArena *pPVar1;
  UnixEventPort *eventPort;
  undefined4 fd;
  undefined8 uVar2;
  undefined8 node;
  char cVar3;
  int iVar4;
  int *piVar5;
  void *pvVar6;
  AsyncStreamFd *this_00;
  PromiseBase extraout_RAX;
  OwnPromiseNode extraout_RAX_00;
  PromiseBase extraout_RAX_01;
  char in_DL;
  undefined7 in_register_00000031;
  _func_int **pp_Var7;
  TransformPromiseNodeBase *this_01;
  OwnFd ownFd;
  socklen_t addrlen;
  Fault f;
  int one;
  sockaddr_storage addr;
  undefined1 local_1b0 [24];
  ConnectionReceiver local_198;
  AsyncStreamFd *pAStack_190;
  PromiseNode *local_188;
  Disposer *pDStack_180;
  undefined1 local_170 [52];
  undefined4 local_13c;
  SocketAddress local_138;
  sockaddr local_b0 [8];
  
  pp_Var7 = (_func_int **)CONCAT71(in_register_00000031,authenticated);
  local_1b0._12_4_ = 0x80;
  iVar4 = accept4(*(int *)(pp_Var7 + 1),local_b0,(socklen_t *)(local_1b0 + 0xc),0x80800);
  if (iVar4 < 0) {
    local_1b0._16_8_ = this;
    piVar5 = __errno_location();
    do {
      iVar4 = *piVar5;
      if (((0x2a < iVar4 - 0x47U) || ((0x68160000001U >> ((ulong)(iVar4 - 0x47U) & 0x3f) & 1) == 0))
         && (iVar4 != 4)) {
        if (iVar4 != 0xb) {
          local_198._vptr_ConnectionReceiver = (_func_int **)0x0;
          local_138.addrlen = 0;
          local_138.wildcard = false;
          local_138._5_3_ = 0;
          local_138.addr._0_8_ = 0;
          kj::_::Debug::Fault::init
                    ((Fault *)&local_198,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                    );
          kj::_::Debug::Fault::fatal((Fault *)&local_198);
        }
        UnixEventPort::FdObserver::whenBecomesReadable((FdObserver *)local_1b0);
        uVar2 = local_1b0._0_8_;
        pPVar1 = (PromiseArena *)
                 ((SleepHooks *)&((PromiseArenaMember *)local_1b0._0_8_)->arena)->_vptr_SleepHooks;
        if (pPVar1 == (PromiseArena *)0x0 || (ulong)(local_1b0._0_8_ - (long)pPVar1) < 0x30) {
          pvVar6 = operator_new(0x400);
          this_01 = (TransformPromiseNodeBase *)((long)pvVar6 + 0x3d0);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    (this_01,(OwnPromiseNode *)local_1b0,
                     kj::_::
                     SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1386:54)>
                     ::anon_class_16_2_d4b6dc1c_for_func::operator());
          *(undefined ***)((long)pvVar6 + 0x3d0) = &PTR_destroy_006e2408;
          *(_func_int ***)((long)pvVar6 + 0x3f0) = pp_Var7;
          *(char *)((long)pvVar6 + 0x3f8) = in_DL;
          *(void **)((long)pvVar6 + 0x3d8) = pvVar6;
        }
        else {
          ((SleepHooks *)&((PromiseArenaMember *)local_1b0._0_8_)->arena)->_vptr_SleepHooks =
               (_func_int **)0x0;
          this_01 = (TransformPromiseNodeBase *)(local_1b0._0_8_ + -0x30);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    (this_01,(OwnPromiseNode *)local_1b0,
                     kj::_::
                     SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1386:54)>
                     ::anon_class_16_2_d4b6dc1c_for_func::operator());
          ((PromiseArenaMember *)(uVar2 + -0x30))->_vptr_PromiseArenaMember =
               (_func_int **)&PTR_destroy_006e2408;
          ((PromiseArenaMember *)(uVar2 + -0x10))->_vptr_PromiseArenaMember = pp_Var7;
          *(char *)&((PromiseArenaMember *)(uVar2 + -0x10))->arena = in_DL;
          ((PromiseArenaMember *)(uVar2 + -0x30))->arena = pPVar1;
        }
        uVar2 = local_1b0._16_8_;
        local_138._0_8_ = &DAT_004ddfe0;
        local_138.addr._0_8_ = &DAT_004de03f;
        local_138.addr.generic.sa_data[6] = 0x8b;
        local_138.addr.generic.sa_data[7] = '\x05';
        local_138.addr.generic.sa_data[8] = '\0';
        local_138.addr.generic.sa_data[9] = '\0';
        local_138.addr.generic.sa_data[10] = 'L';
        local_138.addr.generic.sa_data[0xb] = '\0';
        local_138.addr.generic.sa_data[0xc] = '\0';
        local_138.addr.generic.sa_data[0xd] = '\0';
        local_170._0_8_ = this_01;
        kj::_::PromiseDisposer::
        appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
                  ((PromiseDisposer *)&local_198,(OwnPromiseNode *)local_170,
                   (SourceLocation *)&local_138);
        node = local_170._0_8_;
        ((ConnectionReceiver *)uVar2)->_vptr_ConnectionReceiver = local_198._vptr_ConnectionReceiver
        ;
        if ((TransformPromiseNodeBase *)local_170._0_8_ != (TransformPromiseNodeBase *)0x0) {
          local_170._0_8_ = (TransformPromiseNodeBase *)0x0;
          kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
          local_198._vptr_ConnectionReceiver = (_func_int **)extraout_RAX_00.ptr;
        }
        uVar2 = local_1b0._0_8_;
        if ((UnixEventPort *)local_1b0._0_8_ == (UnixEventPort *)0x0) {
          return (Promise<kj::AuthenticatedStream>)(PromiseNode *)local_198._vptr_ConnectionReceiver
          ;
        }
        local_1b0._0_8_ = (UnixEventPort *)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar2);
        return (Promise<kj::AuthenticatedStream>)(PromiseNode *)extraout_RAX_01.node.ptr;
      }
      iVar4 = accept4(*(int *)(pp_Var7 + 1),local_b0,(socklen_t *)(local_1b0 + 0xc),0x80800);
      this = (FdConnectionReceiver *)local_1b0._16_8_;
    } while (iVar4 < 0);
  }
  local_1b0._0_4_ = iVar4;
  cVar3 = (*(code *)**(undefined8 **)pp_Var7[4])(pp_Var7[4],local_b0,local_1b0._12_4_);
  if (cVar3 == '\0') {
    acceptImpl(this,authenticated);
  }
  else {
    local_13c = 1;
    do {
      iVar4 = ::setsockopt(local_1b0._0_4_,6,1,&local_13c,4);
      if (-1 < iVar4) goto LAB_00493df2;
      iVar4 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar4 == -1);
    if (((iVar4 != 0) && (iVar4 != 0x5c)) && (iVar4 != 0x5f)) {
      local_198._vptr_ConnectionReceiver = (_func_int **)0x0;
      local_138.addrlen = 0;
      local_138.wildcard = false;
      local_138._5_3_ = 0;
      local_138.addr._0_8_ = 0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_198,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_198);
    }
LAB_00493df2:
    local_188 = (PromiseNode *)0x0;
    pDStack_180 = (Disposer *)0x0;
    local_198._vptr_ConnectionReceiver = (_func_int **)0x0;
    pAStack_190 = (AsyncStreamFd *)0x0;
    eventPort = (UnixEventPort *)pp_Var7[3];
    fd = local_1b0._0_4_;
    local_1b0._0_4_ = 0xffffffff;
    this_00 = (AsyncStreamFd *)operator_new(0xa8);
    AsyncStreamFd::AsyncStreamFd(this_00,eventPort,fd,7,3);
    local_198._vptr_ConnectionReceiver =
         (_func_int **)&kj::_::HeapDisposer<kj::(anonymous_namespace)::AsyncStreamFd>::instance;
    if (in_DL == '\0') {
      local_170._8_8_ = (PromiseRejector *)0x0;
      local_170._0_8_ = (PromiseNode *)0x0;
    }
    else {
      pAStack_190 = this_00;
      SocketAddress::SocketAddress(&local_138,local_b0,local_1b0._12_4_);
      SocketAddress::getIdentity
                ((SocketAddress *)local_170,(LowLevelAsyncIoProvider *)&local_138,
                 (NetworkFilter *)pp_Var7[2],(AsyncIoStream *)pp_Var7[4]);
      local_188 = (PromiseNode *)local_170._0_8_;
    }
    local_170._16_8_ = &kj::_::HeapDisposer<kj::(anonymous_namespace)::AsyncStreamFd>::instance;
    pAStack_190 = (AsyncStreamFd *)0x0;
    pDStack_180 = (Disposer *)0x0;
    local_170._24_8_ = this_00;
    local_170._32_8_ = local_170._0_8_;
    local_170._40_8_ = local_170._8_8_;
    kj::_::PromiseDisposer::
    alloc<kj::_::ImmediatePromiseNode<kj::AuthenticatedStream>,kj::_::PromiseDisposer,kj::AuthenticatedStream>
              ((PromiseDisposer *)&local_138,(AuthenticatedStream *)(local_170 + 0x10));
    uVar2 = local_170._40_8_;
    (this->super_ConnectionReceiver)._vptr_ConnectionReceiver = (_func_int **)local_138._0_8_;
    if ((PromiseFulfiller<void> *)local_170._40_8_ != (PromiseFulfiller<void> *)0x0) {
      local_170._40_8_ = (PromiseFulfiller<void> *)0x0;
      (***(_func_int ***)local_170._32_8_)
                (local_170._32_8_,uVar2 + *(long *)((long)*(PromiseRejector *)uVar2 + -0x10));
    }
    uVar2 = local_170._24_8_;
    if ((AsyncStreamFd *)local_170._24_8_ != (AsyncStreamFd *)0x0) {
      local_170._24_8_ = (AsyncStreamFd *)0x0;
      (*(code *)**(undefined8 **)local_170._16_8_)
                (local_170._16_8_,uVar2 + *(long *)(*(long *)uVar2 + -0x10));
    }
  }
  OwnFd::~OwnFd((OwnFd *)local_1b0);
  return (Promise<kj::AuthenticatedStream>)(PromiseNode *)extraout_RAX.node.ptr;
}

Assistant:

Promise<AuthenticatedStream> acceptImpl(bool authenticated) {
    int newFd;

    struct sockaddr_storage addr;
    socklen_t addrlen = sizeof(addr);

  retry:
#if __linux__ && !__BIONIC__
    newFd = ::accept4(fd, reinterpret_cast<struct sockaddr*>(&addr), &addrlen,
                      SOCK_NONBLOCK | SOCK_CLOEXEC);
#else
    newFd = ::accept(fd, reinterpret_cast<struct sockaddr*>(&addr), &addrlen);
#endif

    if (newFd >= 0) {
      kj::OwnFd ownFd(newFd);
      if (!filter.shouldAllow(reinterpret_cast<struct sockaddr*>(&addr), addrlen)) {
        // Ignore disallowed address.
        return acceptImpl(authenticated);
      } else {
        // TODO(perf):  As a hack for the 0.4 release we are always setting
        //   TCP_NODELAY because Nagle's algorithm pretty much kills Cap'n Proto's
        //   RPC protocol.  Later, we should extend the interface to provide more
        //   control over this.  Perhaps write() should have a flag which
        //   specifies whether to pass MSG_MORE.
        int one = 1;
        KJ_SYSCALL_HANDLE_ERRORS(::setsockopt(
              ownFd.get(), IPPROTO_TCP, TCP_NODELAY, (char*)&one, sizeof(one))) {
          case EOPNOTSUPP:
          case ENOPROTOOPT: // (returned for AF_UNIX in cygwin)
#if __FreeBSD__
          case EINVAL: // (returned for AF_UNIX in FreeBSD)
#endif
            break;
          default:
            KJ_FAIL_SYSCALL("setsocketopt(IPPROTO_TCP, TCP_NODELAY)", error);
        }

        AuthenticatedStream result;
        result.stream = heap<AsyncStreamFd>(eventPort, ownFd.release(), NEW_FD_FLAGS,
                                            UnixEventPort::FdObserver::OBSERVE_READ_WRITE);
        if (authenticated) {
          result.peerIdentity = SocketAddress(reinterpret_cast<struct sockaddr*>(&addr), addrlen)
              .getIdentity(lowLevel, filter, *result.stream);
        }
        return kj::mv(result);
      }
    } else {
      int error = errno;

      switch (error) {
        case EAGAIN:
#if EAGAIN != EWOULDBLOCK
        case EWOULDBLOCK:
#endif
          // Not ready yet.
          return observer.whenBecomesReadable().then([this,authenticated]() {
            return acceptImpl(authenticated);
          });

        case EINTR:
        case ENETDOWN:
#ifdef EPROTO
        // EPROTO is not defined on OpenBSD.
        case EPROTO:
#endif
        case EHOSTDOWN:
        case EHOSTUNREACH:
        case ENETUNREACH:
        case ECONNABORTED:
        case ETIMEDOUT:
          // According to the Linux man page, accept() may report an error if the accepted
          // connection is already broken.  In this case, we really ought to just ignore it and
          // keep waiting.  But it's hard to say exactly what errors are such network errors and
          // which ones are permanent errors.  We've made a guess here.
          goto retry;

        default:
          KJ_FAIL_SYSCALL("accept", error);
      }

    }
  }